

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_dump(lua_State *L)

{
  int iVar1;
  int iVar2;
  luaL_Buffer b;
  luaL_Buffer local_2040;
  
  iVar1 = lua_toboolean(L,2);
  iVar2 = 1;
  luaL_checktype(L,1,6);
  lua_settop(L,1);
  luaL_buffinit(L,&local_2040);
  iVar1 = lua_dump(L,writer,&local_2040,iVar1);
  if (iVar1 == 0) {
    luaL_pushresult(&local_2040);
  }
  else {
    iVar2 = luaL_error(L,"unable to dump given function");
  }
  return iVar2;
}

Assistant:

static int str_dump(lua_State *L) {
    luaL_Buffer b;
    int strip = lua_toboolean(L, 2);
    luaL_checktype(L, 1, LUA_TFUNCTION);
    lua_settop(L, 1);
    luaL_buffinit(L, &b);
    if (lua_dump(L, writer, &b, strip) != 0)
        return luaL_error(L, "unable to dump given function");
    luaL_pushresult(&b);
    return 1;
}